

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O2

void __thiscall helics::apps::Recorder::~Recorder(Recorder *this)

{
  (this->super_App)._vptr_App = (_func_int **)&PTR__Recorder_00482988;
  saveFile(this,&(this->super_App).outFileName);
  std::__cxx11::string::~string((string *)&this->mapfile);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->captureInterfaces);
  CLI::std::
  vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>::
  ~vector(&this->vStat);
  CLI::std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->eptNames)._M_t);
  CLI::std::
  _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_int>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_int>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::~_Rb_tree(&(this->eptids)._M_t);
  CLI::std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->subkeys)._M_t);
  CLI::std::
  _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_int>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_int>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::~_Rb_tree(&(this->subids)._M_t);
  CLI::std::
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::~vector(&this->messages);
  CLI::std::unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_>::~unique_ptr
            (&this->cloneEndpoint);
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::~deque(&this->endpoints);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->targets);
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::~deque(&this->subscriptions);
  CLI::std::
  vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
  ::~vector(&this->points);
  CLI::std::unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>::
  ~unique_ptr(&this->cFilt);
  App::~App(&this->super_App);
  return;
}

Assistant:

Recorder::~Recorder()
{
    try {
        saveFile(outFileName);
    }
    catch (...) {
        // destructor should not throw
        ;
    }
}